

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O1

bool __thiscall BinaryModelSerialiser::saveModel(BinaryModelSerialiser *this,QIODevice *destination)

{
  AbstractModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QDataStream witer;
  QDataStream aQStack_38 [24];
  Version local_20;
  
  if (((destination != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)destination + 0x68))(destination,2), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isWritable(), cVar1 != '\0')))) &&
     (this_00 = (this->super_AbstractModelSerialiser).d_ptr.d,
     this_00->m_constModel != (QAbstractItemModel *)0x0)) {
    QDataStream::QDataStream(aQStack_38,destination);
    local_20 = ((AbstractModelSerialiserPrivate *)&this_00->m_streamVersion)->m_streamVersion;
    bVar2 = BinaryModelSerialiserPrivate::writeBinary
                      ((BinaryModelSerialiserPrivate *)this_00,aQStack_38);
    QDataStream::~QDataStream(aQStack_38);
    return bVar2;
  }
  return false;
}

Assistant:

bool BinaryModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const BinaryModelSerialiser);

    if (!d->m_constModel)
        return false;
    QDataStream witer(destination);
    witer.setVersion(d->m_streamVersion);
    return d->writeBinary(witer);
}